

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O1

double filter_bessel(double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long i;
  long lVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar10 = 0.0;
  if ((x == 0.0) && (!NAN(x))) {
    return 0.7853981633974483;
  }
  dVar9 = x * 3.141592653589793;
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    dVar10 = -dVar9;
    if (-dVar9 <= dVar9) {
      dVar10 = dVar9;
    }
    if (8.0 <= dVar10) {
      dVar12 = 2.0 / (dVar10 * 3.141592653589793);
      if (dVar12 < 0.0) {
        dVar12 = sqrt(dVar12);
      }
      else {
        dVar12 = SQRT(dVar12);
      }
      dVar13 = 8.0 / dVar10;
      dVar6 = 1.2571716929145342;
      dVar7 = 1.0;
      lVar4 = 4;
      do {
        dVar6 = dVar6 * dVar13 * dVar13 + *(double *)(KernelBessel_P1_Pone + lVar4 * 8);
        dVar7 = dVar7 * dVar13 * dVar13 + *(double *)(KernelBessel_P1_Qone + lVar4 * 8);
        bVar5 = lVar4 != 0;
        lVar4 = lVar4 + -1;
      } while (bVar5);
      dVar1 = sin(dVar10);
      dVar2 = cos(dVar10);
      dVar11 = 0.03532840052740124;
      dVar8 = 1.0;
      lVar4 = 4;
      do {
        dVar11 = dVar11 * dVar13 * dVar13 + *(double *)(KernelBessel_Q1_Pone + lVar4 * 8);
        dVar8 = dVar8 * dVar13 * dVar13 + *(double *)(KernelBessel_Q1_Qone + lVar4 * 8);
        bVar5 = lVar4 != 0;
        lVar4 = lVar4 + -1;
      } while (bVar5);
      dVar13 = sin(dVar10);
      dVar3 = cos(dVar10);
      dVar12 = dVar12 * ((-8.0 / dVar10) * (dVar11 / dVar8) * (dVar3 + dVar13) * -0.7071067811865475
                        + (dVar1 - dVar2) * 0.7071067811865475 * (dVar6 / dVar7));
      dVar10 = (double)(-(ulong)(dVar9 < 0.0) & (ulong)-dVar12 |
                       ~-(ulong)(dVar9 < 0.0) & (ulong)dVar12);
    }
    else {
      dVar12 = 2701.1227108923235;
      dVar6 = 1.0;
      lVar4 = 7;
      do {
        dVar12 = dVar12 * dVar10 * dVar10 + *(double *)(KernelBessel_J1_Pone + lVar4 * 8);
        dVar6 = dVar6 * dVar10 * dVar10 + *(double *)(KernelBessel_J1_Qone + lVar4 * 8);
        bVar5 = lVar4 != 0;
        lVar4 = lVar4 + -1;
      } while (bVar5);
      dVar10 = dVar9 * (dVar12 / dVar6);
    }
  }
  return dVar10 / (x + x);
}

Assistant:

static double filter_bessel(const double x)
{
	if (x == 0.0f)
		return (double)(M_PI/4.0f);
	return (KernelBessel_Order1((double)M_PI*x)/(2.0f*x));
}